

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

type __thiscall
rest_rpc::rpc_client::call<5000ul,int,int,int>
          (rpc_client *this,string *rpc_name,int *args,int *args_1)

{
  int iVar1;
  out_of_range *this_00;
  int *in_stack_00000030;
  int *in_stack_00000038;
  string *in_stack_00000040;
  rpc_client *in_stack_00000048;
  future_status status;
  future_result<rest_rpc::req_result> future_result;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  future_result<rest_rpc::req_result> *in_stack_ffffffffffffff70;
  unsigned_long local_50;
  duration<long,std::ratio<1l,1000l>> local_48 [12];
  future_status local_3c;
  req_result *in_stack_ffffffffffffffd0;
  
  async_call<(rest_rpc::CallModel)0,int,int>
            (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  local_50 = 5000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>(local_48,&local_50)
  ;
  local_3c = future_result<rest_rpc::req_result>::wait_for<long,std::ratio<1l,1000l>>
                       (in_stack_ffffffffffffff70,
                        (duration<long,_std::ratio<1L,_1000L>_> *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if ((local_3c != timeout) && (local_3c != deferred)) {
    future_result<rest_rpc::req_result>::get
              ((future_result<rest_rpc::req_result> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    iVar1 = req_result::as<int>(in_stack_ffffffffffffffd0);
    req_result::~req_result((req_result *)0x1f3a05);
    future_result<rest_rpc::req_result>::~future_result
              ((future_result<rest_rpc::req_result> *)0x1f3a0f);
    return iVar1;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"timeout or deferred");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

typename std::enable_if<!std::is_void<T>::value, T>::type
  call(const std::string &rpc_name, Args &&...args) {
    auto future_result =
        async_call<FUTURE>(rpc_name, std::forward<Args>(args)...);
    auto status = future_result.wait_for(std::chrono::milliseconds(TIMEOUT));
    if (status == std::future_status::timeout ||
        status == std::future_status::deferred) {
      throw std::out_of_range("timeout or deferred");
    }

    return future_result.get().template as<T>();
  }